

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  uint32_t rlc;
  uint uVar1;
  uint32_t *hlink_00;
  uint64_t **fHeap_00;
  uint64_t *puVar2;
  uint16_t *in;
  ulong in_RDX;
  uint8_t **in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  uint64_t *in_stack_00000008;
  uint8_t *maxcompout;
  uint8_t *tableEnd;
  uint8_t *tableStart;
  uint8_t *compressed;
  uint8_t *dataStart;
  uint32_t dataLength;
  uint32_t nBits;
  uint32_t tableLength;
  uint32_t iM;
  uint32_t im;
  uint64_t *scode;
  uint64_t **fHeap;
  uint32_t *hlink;
  uint64_t *freq;
  exr_result_t rv;
  uint64_t in_stack_ffffffffffffff50;
  uint32_t *iM_00;
  uint64_t *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint32_t local_70;
  uint32_t i;
  uint32_t i_00;
  byte *hcode;
  uint in_stack_ffffffffffffffc0;
  exr_result_t local_4;
  
  i_00 = 0;
  i = 0;
  hlink_00 = (uint32_t *)((long)in_RSI + 0x14);
  fHeap_00 = (uint64_t **)((long)in_RSI + in_RDX);
  if (in_R8 == 0) {
    *in_RDI = 0;
    local_4 = 0;
  }
  else if (in_RDX < 0x14) {
    local_4 = 3;
  }
  else {
    iM_00 = hlink_00;
    puVar2 = (uint64_t *)internal_exr_huf_compress_spare_bytes();
    if (in_stack_00000008 == puVar2) {
      in = (uint16_t *)(in_R9 + 0x80008);
      hcode = Elf64_Ehdr_00100000.e_ident_pad + in_R9 + 7;
      countFrequencies((uint64_t *)fHeap_00,(uint16_t *)in_stack_00000008,in_stack_ffffffffffffff50)
      ;
      hufBuildEncTable(in_stack_ffffffffffffff80,(uint32_t *)in_RSI,iM_00,hlink_00,fHeap_00,
                       in_stack_00000008);
      local_4 = hufPackEncTable((uint64_t *)
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                (uint32_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                (uint32_t)in_stack_ffffffffffffff80,in_RSI,(uint8_t *)iM_00);
      if (local_4 == 0) {
        rlc = (int)hlink_00 - (int)iM_00;
        local_4 = hufEncode((uint64_t *)hcode,in,CONCAT44(i_00,i),rlc,
                            (uint8_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                            ,(uint8_t *)hlink_00,(uint32_t *)(ulong)in_stack_ffffffffffffffc0);
        if (local_4 == 0) {
          uVar1 = local_70 + 7 >> 3;
          writeUInt((uint8_t *)in_RSI,i_00);
          writeUInt((uint8_t *)((long)in_RSI + 4),i);
          writeUInt((uint8_t *)(in_RSI + 1),rlc);
          writeUInt((uint8_t *)((long)in_RSI + 0xc),local_70);
          writeUInt((uint8_t *)(in_RSI + 2),0);
          *in_RDI = (long)hlink_00 + ((ulong)uVar1 - (long)in_RSI);
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*  freq;
    uint32_t*  hlink;
    uint64_t** fHeap;
    uint64_t*  scode;
    uint32_t   im = 0;
    uint32_t   iM = 0;
    uint32_t   tableLength, nBits, dataLength;
    uint8_t*   dataStart;
    uint8_t*   compressed = (uint8_t*) out;
    uint8_t*   tableStart = compressed + 20;
    uint8_t*   tableEnd   = tableStart;
    uint8_t*   maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20)
        return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}